

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

float Gia_ObjComputeArrival(Gia_Man_t *p,int iObj,int fUseSorting)

{
  uint *puVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [34];
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar9 = (uint)*(undefined8 *)(p->pObjs + (uint)iObj);
  if ((~uVar9 & 0x9fffffff) != 0) {
    if ((~uVar9 & 0x1fffffff) == 0 || -1 < (int)uVar9) {
      uVar9 = p->vMapping->nSize;
      if ((int)uVar9 <= iObj) goto LAB_0022a346;
      piVar6 = p->vMapping->pArray;
      uVar10 = piVar6[(uint)iObj];
      uVar13 = (ulong)uVar10;
      if (uVar13 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                      ,0x79,"float Gia_ObjComputeArrival(Gia_Man_t *, int, int)");
      }
      pvVar7 = p->pLutLib;
      if (pvVar7 == (void *)0x0) {
        if (((int)uVar10 < 0) || (uVar9 <= uVar10)) goto LAB_0022a346;
        uVar11 = piVar6[uVar13];
        if (0 < (int)uVar11) {
          uVar14 = 0;
          fVar17 = -1e+09;
          do {
            iVar5 = piVar6[uVar13 + uVar14 + 1];
            if (iVar5 < 0) goto LAB_0022a308;
            uVar4 = iVar5 * 3;
            uVar3 = p->vTiming->nSize;
            if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + iVar5 * -3) < 0)
            goto LAB_0022a308;
            fVar2 = p->vTiming->pArray[uVar4];
            fVar16 = fVar2 + 1.0;
            if (fVar2 + 1.0 <= fVar17) {
              fVar16 = fVar17;
            }
            uVar14 = uVar14 + 1;
            fVar17 = fVar16;
          } while (uVar11 != uVar14);
          goto LAB_0022a2da;
        }
LAB_0022a2e1:
        fVar16 = -1e+09;
      }
      else {
        if (*(int *)((long)pvVar7 + 0xc) == 0) {
          if (uVar9 <= uVar10 || (int)uVar10 < 0) goto LAB_0022a346;
          uVar11 = piVar6[uVar13];
          lVar12 = (long)(int)uVar11;
          if (0 < lVar12) {
            lVar15 = 0;
            fVar17 = -1e+09;
            do {
              iVar5 = piVar6[uVar13 + lVar15 + 1];
              if (iVar5 < 0) goto LAB_0022a308;
              uVar3 = iVar5 * 3;
              uVar11 = p->vTiming->nSize;
              if (uVar11 == uVar3 || SBORROW4(uVar11,uVar3) != (int)(uVar11 + iVar5 * -3) < 0)
              goto LAB_0022a308;
              fVar16 = p->vTiming->pArray[uVar3] + *(float *)((long)pvVar7 + lVar12 * 0x84 + 0x94);
              if (fVar16 <= fVar17) {
                fVar16 = fVar17;
              }
              lVar15 = lVar15 + 1;
              fVar17 = fVar16;
            } while (lVar12 != lVar15);
            goto LAB_0022a2da;
          }
          goto LAB_0022a2e1;
        }
        if (uVar9 <= uVar10 || (int)uVar10 < 0) goto LAB_0022a346;
        uVar11 = piVar6[uVar13];
        lVar12 = (long)(int)uVar11 * 0x84 + 0x94;
        if (fUseSorting != 0) {
          Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
          uVar9 = p->vMapping->nSize;
          if ((int)uVar9 <= iObj) goto LAB_0022a346;
          piVar6 = p->vMapping->pArray;
          uVar10 = piVar6[(uint)iObj];
          if (((long)(int)uVar10 < 0) || (uVar9 <= uVar10)) goto LAB_0022a346;
          puVar1 = (uint *)(piVar6 + (int)uVar10);
          uVar11 = *puVar1;
          if (0 < (int)uVar11) {
            uVar13 = 0;
            fVar17 = -1e+09;
            do {
              uVar3 = puVar1[(long)local_128[uVar13] + 1];
              if ((int)uVar3 < 0) goto LAB_0022a308;
              uVar8 = uVar3 * 3;
              uVar4 = p->vTiming->nSize;
              if (uVar4 == uVar8 || SBORROW4(uVar4,uVar8) != (int)(uVar4 + uVar3 * -3) < 0)
              goto LAB_0022a308;
              fVar16 = p->vTiming->pArray[uVar8] + *(float *)((long)pvVar7 + uVar13 * 4 + lVar12);
              if (fVar16 <= fVar17) {
                fVar16 = fVar17;
              }
              uVar13 = uVar13 + 1;
              fVar17 = fVar16;
            } while (uVar11 != uVar13);
            goto LAB_0022a2da;
          }
          goto LAB_0022a2e1;
        }
        if ((int)uVar11 < 1) goto LAB_0022a2e1;
        lVar15 = 0;
        fVar17 = -1e+09;
        do {
          iVar5 = piVar6[uVar13 + lVar15 + 1];
          if (iVar5 < 0) goto LAB_0022a308;
          uVar4 = iVar5 * 3;
          uVar3 = p->vTiming->nSize;
          if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + iVar5 * -3) < 0)
          goto LAB_0022a308;
          fVar16 = p->vTiming->pArray[uVar4] + *(float *)((long)pvVar7 + lVar15 * 4 + lVar12);
          if (fVar16 <= fVar17) {
            fVar16 = fVar17;
          }
          lVar15 = lVar15 + 1;
          fVar17 = fVar16;
        } while ((int)uVar11 != lVar15);
LAB_0022a2da:
        uVar11 = 1;
      }
      if (((iObj < (int)uVar9) && (-1 < (int)uVar10)) && (uVar10 < uVar9)) {
        if (uVar11 == 0) {
          return 0.0;
        }
        return fVar16;
      }
LAB_0022a346:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iObj = iObj - (uVar9 & 0x1fffffff);
    if (iObj < 0) goto LAB_0022a308;
  }
  uVar10 = iObj * 3;
  uVar9 = p->vTiming->nSize;
  if (uVar9 != uVar10 && SBORROW4(uVar9,uVar10) == (int)(uVar9 + iObj * -3) < 0) {
    return p->vTiming->pArray[uVar10];
  }
LAB_0022a308:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

float Gia_ObjComputeArrival( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tArrival, * pDelays;
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjTimeArrival(p, iObj);
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ObjTimeArrival(p, Gia_ObjFaninId0p(p, pObj) );
    assert( Gia_ObjIsLut(p, iObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + 1.0 )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k ) 
                if ( tArrival < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[k];
        }
    }
    if ( Gia_ObjLutSize(p, iObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}